

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt_string.c
# Opt level: O1

dropt_char * dropt_strndup(dropt_char *s,size_t n)

{
  dropt_char *__dest;
  size_t sVar1;
  size_t __n;
  
  if (s == (dropt_char *)0x0) {
    __assert_fail("s != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/jamesderlin[P]dropt/src/dropt_string.c"
                  ,0xcb,"dropt_char *dropt_strndup(const dropt_char *, size_t)");
  }
  sVar1 = 0;
  __n = sVar1;
  if (n != 0) {
    do {
      __n = sVar1;
      if (s[sVar1] == '\0') break;
      sVar1 = sVar1 + 1;
      __n = n;
    } while (n != sVar1);
  }
  if (__n == 0xffffffffffffffff) {
    __dest = (dropt_char *)0x0;
  }
  else {
    __dest = (dropt_char *)dropt_safe_realloc((void *)0x0,__n + 1,1);
    if (__dest != (dropt_char *)0x0) {
      memcpy(__dest,s,__n);
      __dest[__n] = '\0';
    }
  }
  return __dest;
}

Assistant:

dropt_char*
dropt_strndup(const dropt_char* s, size_t n)
{
    dropt_char* copy;
    size_t len = 0;

    assert(s != NULL);

    while (len < n && s[len] != DROPT_TEXT_LITERAL('\0'))
    {
        len++;
    }

    if (len + 1 < len)
    {
        /* This overflow check shouldn't be strictly necessary. `len` can be at
         * most `SIZE_MAX`, so `SIZE_MAX + 1` can wrap around to 0, but
         * `dropt_safe_malloc` will return `NULL` for a 0-sized allocation.
         * However, favor defensive paranoia.
         */
        return NULL;
    }

    copy = dropt_safe_malloc(len + 1 /* NUL */, sizeof *copy);
    if (copy != NULL)
    {
        memcpy(copy, s, len * sizeof *copy);
        copy[len] = DROPT_TEXT_LITERAL('\0');
    }

    return copy;
}